

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

object * rd_item(void)

{
  wchar_t wVar1;
  artifact *paVar2;
  char *pcVar3;
  ego_item *peVar4;
  monster_race *pmVar5;
  _Bool *p_Var6;
  curse_data *pcVar7;
  quark_t qVar8;
  object_kind *poVar9;
  uint8_t local_a9;
  char local_a8 [7];
  uint8_t ver;
  char buf [128];
  size_t i;
  uint8_t effect;
  uint16_t tmp16u;
  object *poStack_18;
  uint8_t tmp8u;
  object *obj;
  
  poStack_18 = object_new();
  local_a9 = '\x01';
  rd_u16b((uint16_t *)((long)&i + 4));
  rd_byte(&local_a9);
  if (i._4_2_ == 0xffff) {
    rd_u16b(&poStack_18->oidx);
    rd_byte((uint8_t *)((long)&i + 7));
    (poStack_18->grid).y = (uint)i._7_1_;
    rd_byte((uint8_t *)((long)&i + 7));
    (poStack_18->grid).x = (uint)i._7_1_;
    rd_string(local_a8,0x80);
    if (local_a8[0] != '\0') {
      wVar1 = tval_find_idx(local_a8);
      poStack_18->tval = (uint8_t)wVar1;
    }
    rd_string(local_a8,0x80);
    if (local_a8[0] != '\0') {
      wVar1 = lookup_sval((uint)poStack_18->tval,local_a8);
      poStack_18->sval = (uint8_t)wVar1;
    }
    rd_s16b(&poStack_18->pval);
    rd_byte(&poStack_18->number);
    rd_s16b(&poStack_18->weight);
    rd_string(local_a8,0x80);
    if (local_a8[0] != '\0') {
      paVar2 = lookup_artifact_name(local_a8);
      poStack_18->artifact = paVar2;
      if (poStack_18->artifact == (artifact *)0x0) {
        pcVar3 = format("Couldn\'t find artifact %s!",local_a8);
        note(pcVar3);
        return (object *)0x0;
      }
    }
    rd_string(local_a8,0x80);
    if (local_a8[0] != '\0') {
      peVar4 = lookup_ego_item(local_a8,(uint)poStack_18->tval,(uint)poStack_18->sval);
      poStack_18->ego = peVar4;
      if (poStack_18->ego == (ego_item *)0x0) {
        pcVar3 = format("Couldn\'t find ego item %s!",local_a8);
        note(pcVar3);
        return (object *)0x0;
      }
    }
    rd_byte((uint8_t *)((long)&i + 3));
    rd_s16b(&poStack_18->timeout);
    rd_s16b(&poStack_18->to_h);
    rd_s16b(&poStack_18->to_d);
    rd_s16b(&poStack_18->to_a);
    rd_s16b(&poStack_18->ac);
    rd_byte(&poStack_18->dd);
    rd_byte(&poStack_18->ds);
    rd_byte(&poStack_18->origin);
    rd_byte(&poStack_18->origin_depth);
    rd_string(local_a8,0x80);
    if (local_a8[0] != '\0') {
      pmVar5 = lookup_monster(local_a8);
      poStack_18->origin_race = pmVar5;
    }
    rd_byte(&poStack_18->notice);
    buf[0x78] = '\0';
    buf[0x79] = '\0';
    buf[0x7a] = '\0';
    buf[0x7b] = '\0';
    buf[0x7c] = '\0';
    buf[0x7d] = '\0';
    buf[0x7e] = '\0';
    buf[0x7f] = '\0';
    for (; (ulong)buf._120_8_ < (ulong)of_size; buf._120_8_ = buf._120_8_ + 1) {
      rd_byte(poStack_18->flags + buf._120_8_);
    }
    buf[0x78] = '\0';
    buf[0x79] = '\0';
    buf[0x7a] = '\0';
    buf[0x7b] = '\0';
    buf[0x7c] = '\0';
    buf[0x7d] = '\0';
    buf[0x7e] = '\0';
    buf[0x7f] = '\0';
    for (; (ulong)buf._120_8_ < (ulong)obj_mod_max; buf._120_8_ = buf._120_8_ + 1) {
      rd_s16b(poStack_18->modifiers + buf._120_8_);
    }
    rd_byte((uint8_t *)((long)&i + 7));
    if (i._7_1_ != 0) {
      p_Var6 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
      poStack_18->brands = p_Var6;
      buf[0x78] = '\0';
      buf[0x79] = '\0';
      buf[0x7a] = '\0';
      buf[0x7b] = '\0';
      buf[0x7c] = '\0';
      buf[0x7d] = '\0';
      buf[0x7e] = '\0';
      buf[0x7f] = '\0';
      for (; (ulong)buf._120_8_ < (ulong)brand_max; buf._120_8_ = buf._120_8_ + 1) {
        rd_byte((uint8_t *)((long)&i + 7));
        poStack_18->brands[buf._120_8_] = i._7_1_ != 0;
      }
    }
    rd_byte((uint8_t *)((long)&i + 7));
    if (i._7_1_ != 0) {
      p_Var6 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
      poStack_18->slays = p_Var6;
      buf[0x78] = '\0';
      buf[0x79] = '\0';
      buf[0x7a] = '\0';
      buf[0x7b] = '\0';
      buf[0x7c] = '\0';
      buf[0x7d] = '\0';
      buf[0x7e] = '\0';
      buf[0x7f] = '\0';
      for (; (ulong)buf._120_8_ < (ulong)slay_max; buf._120_8_ = buf._120_8_ + 1) {
        rd_byte((uint8_t *)((long)&i + 7));
        poStack_18->slays[buf._120_8_] = i._7_1_ != 0;
      }
    }
    rd_byte((uint8_t *)((long)&i + 7));
    if (i._7_1_ != 0) {
      pcVar7 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
      poStack_18->curses = pcVar7;
      buf[0x78] = '\0';
      buf[0x79] = '\0';
      buf[0x7a] = '\0';
      buf[0x7b] = '\0';
      buf[0x7c] = '\0';
      buf[0x7d] = '\0';
      buf[0x7e] = '\0';
      buf[0x7f] = '\0';
      for (; (ulong)buf._120_8_ < (ulong)curse_max; buf._120_8_ = buf._120_8_ + 1) {
        rd_byte((uint8_t *)((long)&i + 7));
        poStack_18->curses[buf._120_8_].power = (uint)i._7_1_;
        rd_u16b((uint16_t *)((long)&i + 4));
        poStack_18->curses[buf._120_8_].timeout = (uint)i._4_2_;
      }
    }
    buf[0x78] = '\0';
    buf[0x79] = '\0';
    buf[0x7a] = '\0';
    buf[0x7b] = '\0';
    buf[0x7c] = '\0';
    buf[0x7d] = '\0';
    buf[0x7e] = '\0';
    buf[0x7f] = '\0';
    for (; (ulong)buf._120_8_ < (ulong)elem_max; buf._120_8_ = buf._120_8_ + 1) {
      rd_s16b(&poStack_18->el_info[buf._120_8_].res_level);
      rd_byte(&poStack_18->el_info[buf._120_8_].flags);
    }
    rd_s16b(&poStack_18->held_m_idx);
    rd_s16b(&poStack_18->mimicking_m_idx);
    rd_u16b((uint16_t *)((long)&i + 4));
    if (i._4_2_ != 0) {
      poStack_18->activation = activations + i._4_2_;
    }
    rd_u16b((uint16_t *)((long)&i + 4));
    (poStack_18->time).base = (uint)i._4_2_;
    rd_u16b((uint16_t *)((long)&i + 4));
    (poStack_18->time).dice = (uint)i._4_2_;
    rd_u16b((uint16_t *)((long)&i + 4));
    (poStack_18->time).sides = (uint)i._4_2_;
    rd_string(local_a8,0x80);
    if (local_a8[0] != '\0') {
      qVar8 = quark_add(local_a8);
      poStack_18->note = qVar8;
    }
    poVar9 = lookup_kind((uint)poStack_18->tval,(uint)poStack_18->sval);
    poStack_18->kind = poVar9;
    if (((poStack_18->tval == '\0') && (poStack_18->sval == '\0')) ||
       (poStack_18->kind == (object_kind *)0x0)) {
      object_delete((chunk *)0x0,(chunk *)0x0,&stack0xffffffffffffffe8);
      obj = (object *)0x0;
    }
    else {
      if (i._3_1_ != '\0') {
        poStack_18->effect = poStack_18->kind->effect;
      }
      obj = poStack_18;
    }
  }
  else {
    obj = (object *)0x0;
  }
  return obj;
}

Assistant:

static struct object *rd_item(void)
{
	struct object *obj = object_new();

	uint8_t tmp8u;
	uint16_t tmp16u;
	uint8_t effect;
	size_t i;
	char buf[128];
	uint8_t ver = 1;

	rd_u16b(&tmp16u);
	rd_byte(&ver);
	if (tmp16u != 0xffff)
		return NULL;

	rd_u16b(&obj->oidx);

	/* Location */
	rd_byte(&tmp8u);
	obj->grid.y = tmp8u;
	rd_byte(&tmp8u);
	obj->grid.x = tmp8u;

	/* Type/Subtype */
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->tval = tval_find_idx(buf);
	}
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->sval = lookup_sval(obj->tval, buf);
	}
	rd_s16b(&obj->pval);

	rd_byte(&obj->number);
	rd_s16b(&obj->weight);

	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->artifact = lookup_artifact_name(buf);
		if (!obj->artifact) {
			note(format("Couldn't find artifact %s!", buf));
			return NULL;
		}
	}
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->ego = lookup_ego_item(buf, obj->tval, obj->sval);
		if (!obj->ego) {
			note(format("Couldn't find ego item %s!", buf));
			return NULL;
		}
	}
	rd_byte(&effect);

	rd_s16b(&obj->timeout);

	rd_s16b(&obj->to_h);
	rd_s16b(&obj->to_d);
	rd_s16b(&obj->to_a);

	rd_s16b(&obj->ac);

	rd_byte(&obj->dd);
	rd_byte(&obj->ds);

	rd_byte(&obj->origin);
	rd_byte(&obj->origin_depth);
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->origin_race = lookup_monster(buf);
	}
	rd_byte(&obj->notice);

	for (i = 0; i < of_size; i++)
		rd_byte(&obj->flags[i]);

	for (i = 0; i < obj_mod_max; i++) {
		rd_s16b(&obj->modifiers[i]);
	}

	/* Read brands */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
		for (i = 0; i < brand_max; i++) {
			rd_byte(&tmp8u);
			obj->brands[i] = tmp8u ? true : false;
		}
	}

	/* Read slays */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
		for (i = 0; i < slay_max; i++) {
			rd_byte(&tmp8u);
			obj->slays[i] = tmp8u ? true : false;
		}
	}

	/* Read curses */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->curses = mem_zalloc(z_info->curse_max * sizeof(struct curse_data));
		for (i = 0; i < curse_max; i++) {
			rd_byte(&tmp8u);
			obj->curses[i].power = tmp8u;
			rd_u16b(&tmp16u);
			obj->curses[i].timeout = tmp16u;
		}
	}

	for (i = 0; i < elem_max; i++) {
		rd_s16b(&obj->el_info[i].res_level);
		rd_byte(&obj->el_info[i].flags);
	}

	/* Monster holding object */
	rd_s16b(&obj->held_m_idx);

	rd_s16b(&obj->mimicking_m_idx);

	/* Activation */
	rd_u16b(&tmp16u);
	if (tmp16u)
		obj->activation = &activations[tmp16u];
	rd_u16b(&tmp16u);
	obj->time.base = tmp16u;
	rd_u16b(&tmp16u);
	obj->time.dice = tmp16u;
	rd_u16b(&tmp16u);
	obj->time.sides = tmp16u;

	/* Save the inscription */
	rd_string(buf, sizeof(buf));
	if (buf[0]) obj->note = quark_add(buf);

	/* Lookup item kind */
	obj->kind = lookup_kind(obj->tval, obj->sval);

	/* Check we have a kind */
	if ((!obj->tval && !obj->sval) || !obj->kind) {
		object_delete(NULL, NULL, &obj);
		return NULL;
	}

	/* Set effect */
	if (effect)
		obj->effect = obj->kind->effect;

	/* Success */
	return obj;
}